

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  stbi_uc sVar5;
  byte bVar6;
  byte bVar7;
  stbi_uc sVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  stbi_uc *__s;
  stbi_uc *__s_00;
  stbi_uc *psVar18;
  undefined8 *puVar19;
  byte bVar20;
  int iVar21;
  undefined4 in_register_0000000c;
  ulong uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint n;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  size_t __size;
  char *pcVar32;
  size_t __size_00;
  stbi_uc (*pal) [4];
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar23 = stbi__gif_header(s,g,comp,0);
    if (iVar23 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar23 = g->w;
    iVar16 = g->h;
    iVar21 = stbi__mad3sizes_valid(4,iVar23,iVar16,0);
    if (iVar21 == 0) {
      pcVar32 = "GIF image is too large";
      goto LAB_001c6361;
    }
    iVar16 = iVar16 * iVar23;
    __size = (size_t)(iVar16 * 4);
    __s = (stbi_uc *)malloc(__size);
    g->out = __s;
    __s_00 = (stbi_uc *)malloc(__size);
    g->background = __s_00;
    __size_00 = (size_t)iVar16;
    psVar18 = (stbi_uc *)malloc(__size_00);
    g->history = psVar18;
    pcVar32 = "Out of memory";
    if ((__s == (stbi_uc *)0x0) || (psVar18 == (stbi_uc *)0x0 || __s_00 == (stbi_uc *)0x0))
    goto LAB_001c6361;
    memset(__s,0,__size);
    memset(__s_00,0,__size);
    memset(psVar18,0,__size_00);
  }
  else {
    uVar28 = (uint)g->eflags >> 2 & 7;
    uVar15 = g->h * g->w;
    uVar29 = 2;
    if (uVar28 != 3) {
      uVar29 = uVar28;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar29 = uVar28;
    }
    if (uVar29 == 3) {
      if (0 < (int)uVar15) {
        uVar22 = 0;
        do {
          if (g->history[uVar22] != '\0') {
            *(undefined4 *)(g->out + uVar22 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar22 * 4);
          }
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
      }
    }
    else if ((uVar29 == 2) && (0 < (int)uVar15)) {
      uVar22 = 0;
      do {
        if (g->history[uVar22] != '\0') {
          *(undefined4 *)(g->out + uVar22 * 4) = *(undefined4 *)(g->background + uVar22 * 4);
        }
        uVar22 = uVar22 + 1;
      } while (uVar15 != uVar22);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar18 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar18,0,__size_00);
  pal = g->pal;
  while (sVar5 = stbi__get8(s), sVar5 == '!') {
    sVar5 = stbi__get8(s);
    if (sVar5 == 0xf9) {
      bVar6 = stbi__get8(s);
      if (bVar6 == 4) {
        bVar6 = stbi__get8(s);
        g->eflags = (uint)bVar6;
        bVar6 = stbi__get8(s);
        bVar7 = stbi__get8(s);
        g->delay = ((uint)bVar7 * 0x200 + (uint)bVar6 * 2) * 5;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          bVar6 = stbi__get8(s);
          g->transparent = (uint)bVar6;
          g->pal[bVar6][3] = '\0';
          goto LAB_001c61e6;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar18 = s->img_buffer;
LAB_001c61c7:
          s->img_buffer = psVar18 + 1;
        }
        else {
          psVar18 = s->img_buffer;
          iVar23 = (int)s->img_buffer_end - (int)psVar18;
          if (0 < iVar23) goto LAB_001c61c7;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar23);
        }
        g->transparent = -1;
        goto LAB_001c61e6;
      }
      stbi__skip(s,(uint)bVar6);
    }
    else {
LAB_001c61e6:
      while (bVar6 = stbi__get8(s), bVar6 != 0) {
        stbi__skip(s,(uint)bVar6);
      }
    }
  }
  if (sVar5 == ';') {
    return (stbi_uc *)s;
  }
  if (sVar5 == ',') {
    sVar5 = stbi__get8(s);
    sVar8 = stbi__get8(s);
    sVar9 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    sVar11 = stbi__get8(s);
    sVar12 = stbi__get8(s);
    sVar13 = stbi__get8(s);
    sVar14 = stbi__get8(s);
    iVar23 = (uint)CONCAT11(sVar12,sVar11) + (uint)CONCAT11(sVar8,sVar5);
    if (g->w < iVar23) {
      pcVar32 = "Corrupt GIF";
      goto LAB_001c6361;
    }
    iVar16 = (uint)CONCAT11(sVar14,sVar13) + (uint)CONCAT11(sVar10,sVar9);
    if (iVar16 <= g->h) {
      iVar21 = g->w * 4;
      g->line_size = iVar21;
      iVar27 = (uint)CONCAT11(sVar8,sVar5) << 2;
      g->start_x = iVar27;
      iVar24 = (uint)CONCAT11(sVar10,sVar9) * iVar21;
      g->start_y = iVar24;
      g->max_x = iVar23 * 4;
      iVar16 = iVar16 * iVar21;
      g->max_y = iVar16;
      g->cur_x = iVar27;
      if (CONCAT11(sVar12,sVar11) != 0) {
        iVar16 = iVar24;
      }
      g->cur_y = iVar16;
      bVar6 = stbi__get8(s);
      g->lflags = (uint)bVar6;
      iVar23 = g->line_size * 8;
      if ((bVar6 & 0x40) == 0) {
        iVar23 = g->line_size;
      }
      g->step = iVar23;
      g->parse = (int)((uint)bVar6 << 0x19) >> 0x1f & 3;
      if ((char)bVar6 < '\0') {
        pal = g->lpal;
        iVar23 = -1;
        if ((g->eflags & 1) != 0) {
          iVar23 = g->transparent;
        }
        stbi__gif_parse_colortable(s,pal,2 << (bVar6 & 7),iVar23);
      }
      else if ((g->flags & 0x80) == 0) goto LAB_001c6351;
      g->color_table = *pal;
      bVar6 = stbi__get8(s);
      if (0xc < bVar6) {
        return (stbi_uc *)0x0;
      }
      uVar29 = 1 << (bVar6 & 0x1f);
      uVar22 = 0;
      do {
        g->codes[uVar22].prefix = -1;
        g->codes[uVar22].first = (stbi_uc)uVar22;
        g->codes[uVar22].suffix = (stbi_uc)uVar22;
        uVar22 = uVar22 + 1;
      } while (uVar29 != uVar22);
      uVar30 = (2 << (bVar6 & 0x1f)) - 1;
      n = 0;
      iVar23 = 0;
      uVar15 = 0;
      bVar7 = 0;
      uVar28 = uVar29 + 2;
      uVar3 = 0xffffffff;
      iVar16 = bVar6 + 1;
      uVar4 = uVar30;
LAB_001c6456:
      do {
        for (; uVar17 = uVar4, iVar21 = iVar16, uVar25 = uVar3, uVar26 = uVar28, bVar2 = bVar7,
            iVar16 = iVar23 - iVar21, iVar23 < iVar21; iVar23 = iVar23 + 8) {
          if (n == 0) {
            bVar7 = stbi__get8(s);
            if (bVar7 == 0) goto LAB_001c65b2;
            n = (uint)bVar7;
          }
          n = n - 1;
          bVar7 = stbi__get8(s);
          bVar20 = (byte)iVar23;
          uVar15 = uVar15 | (uint)bVar7 << (bVar20 & 0x1f);
          bVar7 = bVar2;
          uVar28 = uVar26;
          uVar3 = uVar25;
          iVar16 = iVar21;
          uVar4 = uVar17;
        }
        uVar28 = (int)uVar15 >> ((byte)iVar21 & 0x1f);
        uVar31 = uVar15 & uVar17;
        iVar23 = iVar16;
        uVar15 = uVar28;
        bVar7 = 1;
        uVar28 = uVar29 + 2;
        uVar3 = 0xffffffff;
        iVar16 = bVar6 + 1;
        uVar4 = uVar30;
      } while (uVar31 == uVar29);
      if (uVar31 == uVar29 + 1) {
        while( true ) {
          stbi__skip(s,n);
          bVar6 = stbi__get8(s);
          if (bVar6 == 0) break;
          n = (uint)bVar6;
        }
LAB_001c65b2:
        psVar18 = g->out;
        if (psVar18 == (stbi_uc *)0x0) {
          return (stbi_uc *)0x0;
        }
        if (psVar1 == (stbi_uc *)0x0) {
          uVar29 = g->h * g->w;
          if (0 < (int)uVar29 && 0 < g->bgindex) {
            uVar22 = 0;
            do {
              if (g->history[uVar22] == '\0') {
                g->pal[g->bgindex][3] = 0xff;
                *(stbi_uc (*) [4])(g->out + uVar22 * 4) = g->pal[g->bgindex];
              }
              uVar22 = uVar22 + 1;
            } while (uVar29 != uVar22);
            return psVar18;
          }
          return psVar18;
        }
        return psVar18;
      }
      if (!(bool)(~bVar2 & 1) && (int)uVar31 <= (int)uVar26) {
        if ((int)uVar25 < 0) {
          if (uVar31 == uVar26) goto LAB_001c6351;
        }
        else {
          if (0x1fff < (int)uVar26) goto LAB_001c6351;
          g->codes[(int)uVar26].prefix = (stbi__int16)uVar25;
          sVar5 = g->codes[uVar25].first;
          g->codes[(int)uVar26].first = sVar5;
          if (uVar31 != uVar26 + 1) {
            sVar5 = g->codes[(int)uVar31].first;
          }
          g->codes[(int)uVar26].suffix = sVar5;
          uVar26 = uVar26 + 1;
        }
        stbi__out_gif_code(g,(stbi__uint16)uVar31);
        bVar7 = 1;
        uVar28 = uVar26;
        uVar3 = uVar31;
        iVar16 = iVar21 + 1;
        uVar4 = ~(-1 << ((byte)(iVar21 + 1) & 0x1f));
        if (0xfff < (int)uVar26 || (uVar26 & uVar17) != 0) {
          iVar16 = iVar21;
          uVar4 = uVar17;
        }
        goto LAB_001c6456;
      }
    }
  }
LAB_001c6351:
  pcVar32 = "Corrupt GIF";
LAB_001c6361:
  puVar19 = (undefined8 *)__tls_get_addr(&PTR_001f3f18);
  *puVar19 = pcVar32;
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}